

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_esni_dispose_context(ptls_esni_context_t *esni)

{
  ptls_key_exchange_context_t **__ptr;
  long lVar1;
  
  __ptr = esni->key_exchanges;
  if (__ptr != (ptls_key_exchange_context_t **)0x0) {
    lVar1 = 0;
    while (*(long *)((long)__ptr + lVar1) != 0) {
      (**(code **)(*(long *)((long)__ptr + lVar1) + 0x18))((long)__ptr + lVar1,1,0,0,0);
      lVar1 = lVar1 + 8;
      __ptr = esni->key_exchanges;
    }
    free(__ptr);
  }
  free(esni->cipher_suites);
  return;
}

Assistant:

void ptls_esni_dispose_context(ptls_esni_context_t *esni)
{
    size_t i;

    if (esni->key_exchanges != NULL) {
        for (i = 0; esni->key_exchanges[i] != NULL; ++i)
            esni->key_exchanges[i]->on_exchange(esni->key_exchanges + i, 1, NULL, ptls_iovec_init(NULL, 0));
        free(esni->key_exchanges);
    }
    free(esni->cipher_suites);
}